

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerSafe::RequestToken
          (CommissionerSafe *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  pointer pcVar1;
  _func_void *p_Var2;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  CommissionerSafe *local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  uint16_t local_38;
  
  local_80 = this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&local_78,aHandler);
  pcVar1 = (aAddr->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + aAddr->_M_string_length);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_38 = aPort;
  p_Var2 = (_func_void *)operator_new(0x50);
  *(CommissionerSafe **)p_Var2 = local_80;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_60;
  if (local_68 != (code *)0x0) {
    *(void **)(p_Var2 + 8) = local_78._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_78._8_8_;
    *(code **)(p_Var2 + 0x18) = local_68;
    local_68 = (code *)0x0;
    uStack_60 = 0;
  }
  *(_func_void **)(p_Var2 + 0x28) = p_Var2 + 0x38;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x28),local_58,local_58 + local_50);
  *(uint16_t *)(p_Var2 + 0x48) = local_38;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:527:22)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:527:22)>
             ::_M_manager;
  local_a8._M_unused._M_function_pointer = p_Var2;
  PushAsyncRequest(this,(AsyncRequest *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::RequestToken(Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    PushAsyncRequest([=]() { mImpl->RequestToken(aHandler, aAddr, aPort); });
}